

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getNewMaterial(ObjFileParser *this)

{
  byte *pbVar1;
  Model *pMVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  iterator iVar6;
  Logger *this_00;
  byte *pbVar7;
  string strMat;
  key_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar7 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar5 = pbVar1 + -1;
  bVar3 = pbVar5 == pbVar7 || pbVar7 == pbVar1;
  if (pbVar5 != pbVar7 && pbVar7 != pbVar1) {
    do {
      if (((ulong)*pbVar7 < 0x21) && ((0x100003601U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0)) {
        if (!bVar3) goto LAB_004adfed;
        break;
      }
      pbVar7 = pbVar7 + 1;
      bVar3 = pbVar7 == pbVar5 || pbVar7 == pbVar1;
    } while (pbVar7 != pbVar5 && pbVar7 != pbVar1);
  }
  goto LAB_004ae007;
  while (pbVar7 != pbVar5) {
LAB_004adfed:
    if (((*pbVar7 != 0x20) && (*pbVar7 != 9)) || (pbVar7 = pbVar7 + 1, pbVar7 == pbVar1)) break;
  }
LAB_004ae007:
  (this->m_DataIt)._M_current = (char *)pbVar7;
  if (pbVar5 != pbVar7 && pbVar7 != pbVar1) {
    while ((*pbVar7 == 0x20 || (*pbVar7 == 9))) {
      pbVar7 = pbVar7 + 1;
      if ((pbVar7 == pbVar1) || (pbVar7 == pbVar5)) break;
    }
  }
  (this->m_DataIt)._M_current = (char *)pbVar7;
  if (pbVar7 != pbVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pbVar7,pbVar7 + (char)*pbVar7);
    pbVar5 = (byte *)(this->m_DataIt)._M_current;
    while (((pbVar5 != (byte *)(this->m_DataItEnd)._M_current && ((ulong)*pbVar5 < 0x21)) &&
           ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
      pbVar5 = pbVar5 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar5;
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
            ::find(&(((this->m_pModel)._M_t.
                      super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                      .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                    m_MaterialMap)._M_t,&local_58);
    if (iVar6._M_node ==
        (_Base_ptr)
        ((long)&(((this->m_pModel)._M_t.
                  super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                  .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_MaterialMap)._M_t + 8U)) {
      this_00 = DefaultLogger::get();
      std::operator+(&local_38,"OBJ: Unsupported material requested: ",&local_58);
      Logger::warn(this_00,local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      pMVar2 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar2->m_pCurrentMaterial = pMVar2->m_pDefaultMaterial;
    }
    else {
      bVar3 = needsNewMesh(this,&local_58);
      if (bVar3) {
        createMesh(this,&local_58);
      }
      uVar4 = getMaterialIndex(this,&local_58);
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh->
      m_uiMaterialIndex = uVar4;
    }
    pbVar5 = (byte *)(this->m_DataIt)._M_current;
    pbVar7 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar7 + -1 != pbVar5 && pbVar5 != pbVar7) {
      do {
        if (((*pbVar5 < 0xe) && ((0x3401U >> (*pbVar5 & 0x1f) & 1) != 0)) ||
           (pbVar5 = pbVar5 + 1, pbVar5 == pbVar7)) break;
      } while (pbVar5 != pbVar7 + -1);
    }
    pbVar1 = pbVar5;
    if (pbVar5 != pbVar7) {
      pbVar5 = pbVar5 + 1;
      this->m_uiLine = this->m_uiLine + 1;
      pbVar1 = pbVar5;
    }
    for (; (pbVar1 != pbVar7 && ((*pbVar1 == 0x20 || (pbVar5 = pbVar1, *pbVar1 == 9))));
        pbVar1 = pbVar1 + 1) {
      pbVar5 = pbVar7;
    }
    (this->m_DataIt)._M_current = (char *)pbVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ObjFileParser::getNewMaterial() {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    std::string strMat( pStart, *m_DataIt );
    while( m_DataIt != m_DataItEnd && IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }
    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( strMat );
    if ( it == m_pModel->m_MaterialMap.end() ) {
        // Show a warning, if material was not found
        ASSIMP_LOG_WARN("OBJ: Unsupported material requested: " + strMat);
        m_pModel->m_pCurrentMaterial = m_pModel->m_pDefaultMaterial;
    } else {
        // Set new material
        if ( needsNewMesh( strMat ) ) {
            createMesh( strMat );
        }
        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex( strMat );
    }

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}